

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# revp.c
# Opt level: O1

void REVcreate_split_action_handler
               (CManager_conflict cm,CMConnection conn,void *data,void *client_data,
               attr_list message_attrs)

{
  EVstone EVar1;
  CMFormat format;
  EV_int_response response;
  undefined4 local_28;
  EVstone local_24;
  
  format = CMlookup_format(conn->cm,EV_int_response_formats);
  if (format == (CMFormat)0x0) {
    format = INT_CMregister_format(conn->cm,EV_int_response_formats);
  }
  EVar1 = EVcreate_split_action(cm,*(EVstone **)((long)data + 8));
  _local_28 = CONCAT44(EVar1,*data);
  CMwrite(conn,format,&local_28);
  return;
}

Assistant:

static void
REVcreate_split_action_handler(CManager cm, CMConnection conn, void *data,void *client_data,attr_list message_attrs)
{
    EV_int_response response;
    EVcreate_split_action_request *request = (EVcreate_split_action_request *) data;
    EVstone ret;
    CMFormat f = CMlookup_format(conn->cm, EV_int_response_formats);
    (void) message_attrs;
    (void) client_data;
    if (f == NULL) {
        f = INT_CMregister_format(conn->cm, EV_int_response_formats);
    }
    ret = EVcreate_split_action(cm, request->target_list);
    response.ret = (int)ret;
    response.condition_var = request->condition_var;
    CMwrite(conn, f, &response);
}